

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

int PAL_iswupper(char16_t c)

{
  BOOL BVar1;
  int iVar2;
  UnicodeDataRec local_18;
  UnicodeDataRec dataRec;
  BOOL bRetVal;
  char16_t c_local;
  
  dataRec.nUnicodeValue = L'\0';
  dataRec.C1_TYPE_FLAGS = 0;
  dataRec.rangeValue = c;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  BVar1 = GetUnicodeData((uint)(ushort)c,&local_18);
  if (BVar1 == 0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
  }
  else if ((local_18.C1_TYPE_FLAGS & 1) != 0) {
    dataRec.nUnicodeValue = L'\x01';
    dataRec.C1_TYPE_FLAGS = 0;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    iVar2._0_2_ = dataRec.nUnicodeValue;
    iVar2._2_2_ = dataRec.C1_TYPE_FLAGS;
    return iVar2;
  }
  abort();
}

Assistant:

int
__cdecl
PAL_iswupper( char16_t c )
{
    BOOL bRetVal = FALSE;
#if HAVE_COREFOUNDATION
    static CFCharacterSetRef sUppercaseSet;

    if (sUppercaseSet == NULL)
    {
        sUppercaseSet = CFCharacterSetGetPredefined(
                                        kCFCharacterSetUppercaseLetter);
    }
    PERF_ENTRY(iswupper);
    ENTRY( "iswupper (c=%d)\n", c );
    bRetVal = CFCharacterSetIsCharacterMember(sUppercaseSet, c);
#else   /* HAVE_COREFOUNDATION */
    UnicodeDataRec dataRec;

    PERF_ENTRY(iswupper);
    ENTRY( "iswupper (c=%d)\n", c );

    if (!GetUnicodeData(c, &dataRec))
    {
        TRACE( "Unable to retrieve unicode data for the character %c.\n", c );
        goto exit;
    }

    if (dataRec.C1_TYPE_FLAGS & C1_UPPER)
    {
        bRetVal = TRUE;
    }
exit:
#endif  /* HAVE_COREFOUNDATION */
    LOGEXIT( "iswupper returns %s.\n", bRetVal == TRUE ? "TRUE" : "FALSE" );
    PERF_EXIT(iswupper);
    return bRetVal;
}